

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.h
# Opt level: O2

void __thiscall
Iir::PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_3,_3>::PoleFilter
          (PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_3,_3> *this)

{
  Storage local_30;
  
  PoleFilterBase<Iir::Butterworth::AnalogLowPass>::PoleFilterBase
            ((PoleFilterBase<Iir::Butterworth::AnalogLowPass> *)this);
  CascadeStages<2,_Iir::DirectFormII>::CascadeStages
            (&this->super_CascadeStages<2,_Iir::DirectFormII>);
  memset(&this->m_analogStorage,0,0x100);
  local_30.maxStages = 2;
  local_30.stageArray = (this->super_CascadeStages<2,_Iir::DirectFormII>).m_stages;
  Cascade::setCascadeStorage((Cascade *)this,&local_30);
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_numPoles = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_maxPoles = 3;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_pair = (this->m_analogStorage).m_pairs;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_numPoles = 0;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_maxPoles = 3;
  (this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_pair = (this->m_digitalStorage).m_pairs;
  *(undefined4 *)
   &(this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalW = 0;
  *(undefined4 *)
   ((long)&(this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalW + 4) = 0;
  *(undefined4 *)
   &(this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalGain = 0;
  *(undefined4 *)
   ((long)&(this->super_HighPassBase).super_PoleFilterBase<Iir::Butterworth::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalGain + 4) = 0x3ff00000;
  (this->super_CascadeStages<2,_Iir::DirectFormII>).m_states[0].m_v1 = 0.0;
  (this->super_CascadeStages<2,_Iir::DirectFormII>).m_states[0].m_v2 = 0.0;
  (this->super_CascadeStages<2,_Iir::DirectFormII>).m_states[1].m_v1 = 0.0;
  (this->super_CascadeStages<2,_Iir::DirectFormII>).m_states[1].m_v2 = 0.0;
  return;
}

Assistant:

PoleFilter ()
			{
				// This glues together the factored base classes
				// with the templatized storage classes.
				BaseClass::setCascadeStorage (this->getCascadeStorage());
				BaseClass::setPrototypeStorage (m_analogStorage, m_digitalStorage);
				CascadeStages<(MaxDigitalPoles + 1) / 2 , StateType>::reset();
			}